

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawLine
          (PixelGameEngine *this,int32_t x1,int32_t y1,int32_t x2,int32_t y2,Pixel p,
          uint32_t pattern)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  
  uVar4 = x2 - x1;
  if (uVar4 == 0) {
    uVar8 = (ulong)(uint)y1;
    if (y2 < y1) {
      uVar8 = (ulong)(uint)y2;
    }
    if (y1 < y2) {
      y1 = y2;
    }
    do {
      bVar13 = (int)pattern < 0;
      pattern = pattern << 1 | (uint)bVar13;
      if (bVar13 != 0) {
        (*this->_vptr_PixelGameEngine[5])(this,(ulong)(uint)x1,uVar8,(ulong)(uint)p.field_0);
      }
      uVar4 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar4;
    } while (y1 + 1U != uVar4);
  }
  else if (y2 == y1) {
    iVar6 = x1;
    if (x1 < x2) {
      iVar6 = x2;
    }
    uVar8 = (ulong)(uint)x1;
    if (x2 < x1) {
      uVar8 = (ulong)(uint)x2;
    }
    do {
      bVar13 = (int)pattern < 0;
      pattern = pattern << 1 | (uint)bVar13;
      if (bVar13 != 0) {
        (*this->_vptr_PixelGameEngine[5])(this,uVar8,(ulong)(uint)y1,(ulong)(uint)p.field_0);
      }
      uVar4 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar4;
    } while (iVar6 + 1U != uVar4);
  }
  else {
    uVar5 = y2 - y1;
    uVar1 = -uVar4;
    if (0 < (int)uVar4) {
      uVar1 = uVar4;
    }
    uVar2 = -uVar5;
    if (0 < (int)uVar5) {
      uVar2 = uVar5;
    }
    uVar10 = (uint)((int)pattern < 0);
    uVar12 = pattern << 1 | uVar10;
    if (uVar2 < uVar1 || uVar2 - uVar1 == 0) {
      uVar8 = (ulong)(uint)x2;
      if (-1 < (int)uVar4) {
        uVar8 = (ulong)(uint)x1;
      }
      uVar9 = (ulong)(uint)y2;
      if (-1 < (int)uVar4) {
        uVar9 = (ulong)(uint)y1;
        x1 = x2;
      }
      uVar7 = (uint)uVar8;
      if (uVar10 != 0) {
        (*this->_vptr_PixelGameEngine[5])(this,uVar8,uVar9,(ulong)(uint)p.field_0);
      }
      if ((int)uVar7 < x1) {
        iVar11 = uVar2 * 2 - uVar1;
        do {
          uVar7 = uVar7 + 1;
          uVar10 = (0 < (int)uVar5 && 0 < (int)uVar4 || (int)(uVar4 & uVar5) < 0) - 1 | 1;
          iVar3 = (uVar2 - uVar1) * 2;
          if (iVar11 < 0) {
            uVar10 = 0;
            iVar3 = uVar2 * 2;
          }
          uVar9 = (ulong)(uVar10 + (int)uVar9);
          bVar13 = (int)uVar12 < 0;
          uVar12 = uVar12 << 1 | (uint)bVar13;
          if (bVar13 != 0) {
            (*this->_vptr_PixelGameEngine[5])(this,(ulong)uVar7,uVar9,(ulong)(uint)p.field_0);
          }
          iVar11 = iVar11 + iVar3;
        } while (uVar7 != x1);
      }
    }
    else {
      uVar8 = (ulong)(uint)x2;
      if (-1 < (int)uVar5) {
        uVar8 = (ulong)(uint)x1;
      }
      uVar9 = (ulong)(uint)y2;
      if (-1 < (int)uVar5) {
        uVar9 = (ulong)(uint)y1;
        y1 = y2;
      }
      uVar7 = (uint)uVar9;
      if (uVar10 != 0) {
        (*this->_vptr_PixelGameEngine[5])(this,uVar8,uVar9,(ulong)(uint)p.field_0);
      }
      if ((int)uVar7 < y1) {
        iVar11 = uVar1 * 2 - uVar2;
        do {
          uVar7 = uVar7 + 1;
          uVar10 = (0 < (int)uVar5 && 0 < (int)uVar4 || (int)(uVar4 & uVar5) < 0) - 1 | 1;
          iVar3 = (uVar1 - uVar2) * 2;
          if (iVar11 < 1) {
            uVar10 = 0;
            iVar3 = uVar1 * 2;
          }
          uVar10 = uVar10 + (int)uVar8;
          uVar8 = (ulong)uVar10;
          bVar13 = (int)uVar12 < 0;
          uVar12 = uVar12 << 1 | (uint)bVar13;
          if (bVar13 != 0) {
            (*this->_vptr_PixelGameEngine[5])
                      (this,(ulong)uVar10,(ulong)uVar7,(ulong)(uint)p.field_0);
          }
          iVar11 = iVar11 + iVar3;
        } while (uVar7 != y1);
      }
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawLine(int32_t x1, int32_t y1, int32_t x2, int32_t y2, Pixel p, uint32_t pattern)
	{
		int x, y, dx, dy, dx1, dy1, px, py, xe, ye, i;
		dx = x2 - x1; dy = y2 - y1;

		auto rol = [&](void) { pattern = (pattern << 1) | (pattern >> 31); return pattern & 1; };

		// straight lines idea by gurkanctn
		if (dx == 0) // Line is vertical
		{
			if (y2 < y1) std::swap(y1, y2);
			for (y = y1; y <= y2; y++) if (rol()) Draw(x1, y, p);
			return;
		}

		if (dy == 0) // Line is horizontal
		{
			if (x2 < x1) std::swap(x1, x2);
			for (x = x1; x <= x2; x++) if (rol()) Draw(x, y1, p);
			return;
		}

		// Line is Funk-aye
		dx1 = abs(dx); dy1 = abs(dy);
		px = 2 * dy1 - dx1;	py = 2 * dx1 - dy1;
		if (dy1 <= dx1)
		{
			if (dx >= 0)
			{
				x = x1; y = y1; xe = x2;
			}
			else
			{
				x = x2; y = y2; xe = x1;
			}

			if (rol()) Draw(x, y, p);

			for (i = 0; x < xe; i++)
			{
				x = x + 1;
				if (px < 0)
					px = px + 2 * dy1;
				else
				{
					if ((dx < 0 && dy < 0) || (dx > 0 && dy > 0)) y = y + 1; else y = y - 1;
					px = px + 2 * (dy1 - dx1);
				}
				if (rol()) Draw(x, y, p);
			}
		}
		else
		{
			if (dy >= 0)
			{
				x = x1; y = y1; ye = y2;
			}
			else
			{
				x = x2; y = y2; ye = y1;
			}

			if (rol()) Draw(x, y, p);

			for (i = 0; y < ye; i++)
			{
				y = y + 1;
				if (py <= 0)
					py = py + 2 * dx1;
				else
				{
					if ((dx < 0 && dy < 0) || (dx > 0 && dy > 0)) x = x + 1; else x = x - 1;
					py = py + 2 * (dx1 - dy1);
				}
				if (rol()) Draw(x, y, p);
			}
		}
	}